

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

Interval pbrt::Sqr(Interval i)

{
  bool bVar1;
  Interval *pIVar2;
  Float FVar3;
  float fVar4;
  undefined1 in_ZMM0 [64];
  Float ahigh;
  Float alow;
  Float in_stack_ffffffffffffffd8;
  Float in_stack_ffffffffffffffdc;
  Interval this;
  float local_18;
  Float local_14;
  Interval local_10;
  Interval local_8;
  
  local_10 = (Interval)vmovlpd_avx(in_ZMM0._0_16_);
  pIVar2 = &local_10;
  FVar3 = Interval::LowerBound(pIVar2);
  std::abs((int)pIVar2);
  pIVar2 = &local_10;
  local_14 = FVar3;
  fVar4 = Interval::UpperBound(pIVar2);
  std::abs((int)pIVar2);
  local_18 = fVar4;
  if (fVar4 < local_14) {
    pstd::swap<float>(&local_14,&local_18);
  }
  this = local_10;
  bVar1 = InRange(in_stack_ffffffffffffffdc,local_10);
  if (bVar1) {
    MulRoundUp(0.0,9.827655e-39);
    Interval::Interval((Interval *)this,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  }
  else {
    FVar3 = MulRoundDown(0.0,9.827707e-39);
    MulRoundUp(0.0,9.827739e-39);
    Interval::Interval((Interval *)this,FVar3,in_stack_ffffffffffffffd8);
  }
  return local_8;
}

Assistant:

PBRT_CPU_GPU inline Interval Sqr(Interval i) {
    Float alow = std::abs(i.LowerBound()), ahigh = std::abs(i.UpperBound());
    if (alow > ahigh)
        pstd::swap(alow, ahigh);
    if (InRange(0, i))
        return Interval(0, MulRoundUp(ahigh, ahigh));
    return Interval(MulRoundDown(alow, alow), MulRoundUp(ahigh, ahigh));
}